

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

QDebugIfHasDebugStream<QByteArray,_QByteArray>
operator<<(QDebug *debug,pair<QByteArray,_QByteArray> *pair)

{
  QDebug *in_RDX;
  QByteArray *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  QDebugStateSaver saver;
  Stream *this;
  QDebugStateSaver *this_00;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = (QDebugStateSaver *)&local_10;
  this = in_RDI;
  QDebugStateSaver::QDebugStateSaver(this_00,(QDebug *)in_RSI);
  QDebug::nospace((QDebug *)in_RSI);
  QDebug::operator<<(in_RDX,in_stack_00000008);
  QDebug::operator<<((QDebug *)this_00,in_RSI);
  QDebug::operator<<(in_RDX,in_stack_00000008);
  QDebug::operator<<((QDebug *)this_00,in_RSI);
  QDebug::operator<<((QDebug *)this,(char)((ulong)in_RDI >> 0x38));
  QDebug::QDebug((QDebug *)this,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebugIfHasDebugStream<QByteArray,_QByteArray>)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebugIfHasDebugStream<T1, T2> operator<<(QDebug debug, const std::pair<T1, T2> &pair)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << "std::pair(" << pair.first << ", " << pair.second << ')';
    return debug;
}